

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinderTester_0000_0999.cpp
# Opt level: O2

void __thiscall psy::C::DeclarationBinderTester::case0914(DeclarationBinderTester *this)

{
  socklen_t in_ECX;
  allocator<char> local_e1;
  string local_e0 [32];
  Expectation local_c0;
  
  std::__cxx11::string::string<std::allocator<char>>(local_e0,"struct { int x ; } ;",&local_e1);
  Expectation::Expectation(&local_c0);
  bind(this,(int)local_e0,(sockaddr *)&local_c0,in_ECX);
  Expectation::~Expectation(&local_c0);
  std::__cxx11::string::~string(local_e0);
  return;
}

Assistant:

void DeclarationBinderTester::case0914()
{
    CROSS_REFERENCE_TEST(ParserTester::case0406);

    bind("struct { int x ; } ;");
}